

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O3

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_miter
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,vertex_dist *v0,vertex_dist *v1,
          vertex_dist *v2,double dx1,double dy1,double dx2,double dy2,line_join_e lj,double mlimit,
          double dbevel)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  point_base<double> *ppVar19;
  ulong uVar20;
  point_base<double> **pppVar21;
  uint uVar22;
  uint uVar23;
  double dVar25;
  undefined1 auVar24 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dStack_e0;
  double dStack_d0;
  double dStack_c0;
  double dStack_90;
  
  dVar28 = v0->x + dx1;
  dStack_e0 = v0->y - dy1;
  auVar3._0_8_ = v1->x;
  auVar3._8_8_ = v1->y;
  dVar30 = (double)auVar3._0_8_ + dx1;
  dStack_90 = (double)auVar3._8_8_ - dy1;
  dVar4 = (double)auVar3._0_8_ + dx2;
  dVar25 = (double)auVar3._8_8_ - dy2;
  dVar27 = v2->x;
  dVar2 = v2->y;
  dVar31 = (dVar27 + dx2) - dVar4;
  dVar32 = (dVar2 - dy2) - dVar25;
  dVar29 = (dVar30 - dVar28) * dVar32 - (dStack_90 - dStack_e0) * dVar31;
  dVar26 = this->m_width_abs * mlimit;
  dVar10 = ABS(dVar29);
  if (dVar10 < 1e-30) {
    auVar24._8_8_ = 0;
    auVar24._0_8_ = v0->y;
    auVar24 = blendpd(auVar24,auVar3,2);
    if (((double)auVar3._8_8_ - auVar24._0_8_) * (dVar30 - (double)auVar3._0_8_) -
        ((double)auVar3._0_8_ - v0->x) * (dStack_90 - (double)auVar3._8_8_) < 0.0 !=
        0.0 <= (dVar2 - auVar24._8_8_) * (dVar30 - dVar27) -
               (dVar27 - (double)auVar3._0_8_) * (dStack_90 - dVar2)) {
      uVar18 = vc->m_size;
      uVar22 = uVar18 >> 6;
      if (vc->m_num_blocks <= uVar22) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar22);
        uVar18 = vc->m_size;
      }
      pdVar1 = (double *)((long)&vc->m_blocks[uVar22]->x + (ulong)((uVar18 & 0x3f) << 4));
      *pdVar1 = dVar30;
      pdVar1[1] = dStack_90;
      goto LAB_0011aa3b;
    }
    dVar27 = 1.0;
    dVar28 = (double)auVar3._0_8_;
    dStack_e0 = (double)auVar3._8_8_;
LAB_0011a84b:
    if (lj == miter_join_round) {
      calc_arc(this,vc,(double)auVar3._0_8_,(double)auVar3._8_8_,dx1,-dy1,dx2,-dy2);
      return;
    }
    if (lj == miter_join_revert) {
      uVar18 = vc->m_size;
      uVar22 = vc->m_num_blocks;
      uVar23 = uVar18 >> 6;
      if (uVar22 <= uVar23) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar23);
        uVar18 = vc->m_size;
        uVar22 = vc->m_num_blocks;
      }
      pppVar21 = vc->m_blocks;
      pdVar1 = (double *)((long)&pppVar21[uVar23]->x + (ulong)((uVar18 & 0x3f) << 4));
      *pdVar1 = dVar30;
      pdVar1[1] = dStack_90;
      uVar18 = uVar18 + 1;
      vc->m_size = uVar18;
      dVar27 = v1->x;
      dVar2 = v1->y;
      uVar23 = uVar18 >> 6;
      if (uVar22 <= uVar23) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar23);
        uVar18 = vc->m_size;
        pppVar21 = vc->m_blocks;
      }
      ppVar19 = pppVar21[uVar23];
      uVar20 = (ulong)((uVar18 & 0x3f) << 4);
      *(double *)((long)&ppVar19->x + uVar20) = dx2 + dVar27;
      *(double *)((long)&ppVar19->y + uVar20) = dVar2 - dy2;
      goto LAB_0011aa3b;
    }
    if (dVar10 < 1e-30) {
      dVar27 = (double)this->m_width_sign * mlimit;
      dVar30 = dy1 * dVar27 + dVar30;
      dStack_c0 = dx1 * dVar27 + dStack_90;
      uVar18 = vc->m_size;
      uVar22 = vc->m_num_blocks;
      uVar23 = uVar18 >> 6;
      dStack_d0 = dVar27;
      if (uVar22 <= uVar23) {
        auVar5._8_4_ = SUB84(dStack_c0,0);
        auVar5._0_8_ = dVar30;
        auVar5._12_4_ = (int)((ulong)dStack_c0 >> 0x20);
        auVar17._8_4_ = SUB84(dVar27,0);
        auVar17._0_8_ = dVar27;
        auVar17._12_4_ = (int)((ulong)dVar27 >> 0x20);
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar23);
        dStack_d0 = auVar17._8_8_;
        dStack_c0 = auVar5._8_8_;
        uVar18 = vc->m_size;
        uVar22 = vc->m_num_blocks;
      }
      pppVar21 = vc->m_blocks;
      auVar6._8_4_ = SUB84(dStack_c0,0);
      auVar6._0_8_ = dVar30;
      auVar6._12_4_ = (int)((ulong)dStack_c0 >> 0x20);
      *(undefined1 (*) [16])((long)&pppVar21[uVar23]->x + (ulong)((uVar18 & 0x3f) << 4)) = auVar6;
      uVar18 = uVar18 + 1;
      vc->m_size = uVar18;
      dVar27 = (dx2 + v1->x) - dy2 * dVar27;
      dStack_e0 = (v1->y - dy2) - dx2 * dStack_d0;
      uVar23 = uVar18 >> 6;
      if (uVar22 <= uVar23) {
        auVar8._8_4_ = SUB84(dStack_e0,0);
        auVar8._0_8_ = dVar27;
        auVar8._12_4_ = (int)((ulong)dStack_e0 >> 0x20);
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar23);
        dStack_e0 = auVar8._8_8_;
        uVar18 = vc->m_size;
        pppVar21 = vc->m_blocks;
      }
      auVar9._8_4_ = SUB84(dStack_e0,0);
      auVar9._0_8_ = dVar27;
      auVar9._12_4_ = (int)((ulong)dStack_e0 >> 0x20);
      *(undefined1 (*) [16])((long)&pppVar21[uVar23]->x + (ulong)((uVar18 & 0x3f) << 4)) = auVar9;
      goto LAB_0011aa3b;
    }
    dVar27 = (dVar26 - dbevel) / (dVar27 - dbevel);
    dVar30 = (dVar28 - dVar30) * dVar27 + dVar30;
    dStack_90 = (dStack_e0 - dStack_90) * dVar27 + dStack_90;
    uVar18 = vc->m_size;
    uVar22 = vc->m_num_blocks;
    uVar23 = uVar18 >> 6;
    dStack_d0 = dVar27;
    if (uVar22 <= uVar23) {
      auVar13._8_4_ = SUB84(dStack_e0,0);
      auVar13._0_8_ = dVar28;
      auVar13._12_4_ = (int)((ulong)dStack_e0 >> 0x20);
      auVar7._8_4_ = SUB84(dVar27,0);
      auVar7._0_8_ = dVar27;
      auVar7._12_4_ = (int)((ulong)dVar27 >> 0x20);
      auVar15._8_4_ = SUB84(dStack_90,0);
      auVar15._0_8_ = dVar30;
      auVar15._12_4_ = (int)((ulong)dStack_90 >> 0x20);
      pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar23);
      dStack_90 = auVar15._8_8_;
      dStack_d0 = auVar7._8_8_;
      dStack_e0 = auVar13._8_8_;
      uVar18 = vc->m_size;
      uVar22 = vc->m_num_blocks;
    }
    pppVar21 = vc->m_blocks;
    auVar16._8_4_ = SUB84(dStack_90,0);
    auVar16._0_8_ = dVar30;
    auVar16._12_4_ = (int)((ulong)dStack_90 >> 0x20);
    *(undefined1 (*) [16])((long)&pppVar21[uVar23]->x + (ulong)((uVar18 & 0x3f) << 4)) = auVar16;
    uVar18 = uVar18 + 1;
    vc->m_size = uVar18;
    dVar28 = (dVar28 - dVar4) * dVar27 + dVar4;
    dStack_e0 = (dStack_e0 - dVar25) * dStack_d0 + dVar25;
    uVar23 = uVar18 >> 6;
    if (uVar22 <= uVar23) {
      auVar14._8_4_ = SUB84(dStack_e0,0);
      auVar14._0_8_ = dVar28;
      auVar14._12_4_ = (int)((ulong)dStack_e0 >> 0x20);
      pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar23);
      dStack_e0 = auVar14._8_8_;
      uVar18 = vc->m_size;
      pppVar21 = vc->m_blocks;
    }
    ppVar19 = pppVar21[uVar23];
  }
  else {
    dVar29 = ((dStack_e0 - dVar25) * dVar31 - dVar32 * (dVar28 - dVar4)) / dVar29;
    dVar28 = dVar29 * (dVar30 - dVar28) + dVar28;
    dStack_e0 = dVar29 * (dStack_90 - dStack_e0) + dStack_e0;
    dVar27 = SQRT((dVar28 - (double)auVar3._0_8_) * (dVar28 - (double)auVar3._0_8_) +
                  (dStack_e0 - (double)auVar3._8_8_) * (dStack_e0 - (double)auVar3._8_8_));
    if (dVar26 < dVar27) goto LAB_0011a84b;
    uVar18 = vc->m_size;
    uVar22 = uVar18 >> 6;
    if (vc->m_num_blocks <= uVar22) {
      auVar11._8_4_ = SUB84(dStack_e0,0);
      auVar11._0_8_ = dVar28;
      auVar11._12_4_ = (int)((ulong)dStack_e0 >> 0x20);
      pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar22);
      dStack_e0 = auVar11._8_8_;
      uVar18 = vc->m_size;
    }
    ppVar19 = vc->m_blocks[uVar22];
  }
  auVar12._8_4_ = SUB84(dStack_e0,0);
  auVar12._0_8_ = dVar28;
  auVar12._12_4_ = (int)((ulong)dStack_e0 >> 0x20);
  *(undefined1 (*) [16])((long)&ppVar19->x + (ulong)((uVar18 & 0x3f) << 4)) = auVar12;
LAB_0011aa3b:
  vc->m_size = uVar18 + 1;
  return;
}

Assistant:

void math_stroke<VC>::calc_miter(VC& vc,
                                     const vertex_dist& v0, 
                                     const vertex_dist& v1, 
                                     const vertex_dist& v2,
                                     double dx1, double dy1, 
                                     double dx2, double dy2,
                                     line_join_e lj,
                                     double mlimit,
                                     double dbevel)
    {
        double xi  = v1.x;
        double yi  = v1.y;
        double di  = 1;
        double lim = m_width_abs * mlimit;
        bool miter_limit_exceeded = true; // Assume the worst
        bool intersection_failed  = true; // Assume the worst

        if(calc_intersection(v0.x + dx1, v0.y - dy1,
                             v1.x + dx1, v1.y - dy1,
                             v1.x + dx2, v1.y - dy2,
                             v2.x + dx2, v2.y - dy2,
                             &xi, &yi))
        {
            // Calculation of the intersection succeeded
            //---------------------
            di = calc_distance(v1.x, v1.y, xi, yi);
            if(di <= lim)
            {
                // Inside the miter limit
                //---------------------
                add_vertex(vc, xi, yi);
                miter_limit_exceeded = false;
            }
            intersection_failed = false;
        }
        else
        {
            // Calculation of the intersection failed, most probably
            // the three points lie one straight line. 
            // First check if v0 and v2 lie on the opposite sides of vector: 
            // (v1.x, v1.y) -> (v1.x+dx1, v1.y-dy1), that is, the perpendicular
            // to the line determined by vertices v0 and v1.
            // This condition determines whether the next line segments continues
            // the previous one or goes back.
            //----------------
            double x2 = v1.x + dx1;
            double y2 = v1.y - dy1;
            if((cross_product(v0.x, v0.y, v1.x, v1.y, x2, y2) < 0.0) == 
               (cross_product(v1.x, v1.y, v2.x, v2.y, x2, y2) < 0.0))
            {
                // This case means that the next segment continues 
                // the previous one (straight line)
                //-----------------
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                miter_limit_exceeded = false;
            }
        }

        if(miter_limit_exceeded)
        {
            // Miter limit exceeded
            //------------------------
            switch(lj)
            {
            case miter_join_revert:
                // For the compatibility with SVG, PDF, etc, 
                // we use a simple bevel join instead of
                // "smart" bevel
                //-------------------
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                add_vertex(vc, v1.x + dx2, v1.y - dy2);
                break;

            case miter_join_round:
                calc_arc(vc, v1.x, v1.y, dx1, -dy1, dx2, -dy2);
                break;

            default:
                // If no miter-revert, calculate new dx1, dy1, dx2, dy2
                //----------------
                if(intersection_failed)
                {
                    mlimit *= m_width_sign;
                    add_vertex(vc, v1.x + dx1 + dy1 * mlimit, 
                                   v1.y - dy1 + dx1 * mlimit);
                    add_vertex(vc, v1.x + dx2 - dy2 * mlimit, 
                                   v1.y - dy2 - dx2 * mlimit);
                }
                else
                {
                    double x1 = v1.x + dx1;
                    double y1 = v1.y - dy1;
                    double x2 = v1.x + dx2;
                    double y2 = v1.y - dy2;
                    di = (lim - dbevel) / (di - dbevel);
                    add_vertex(vc, x1 + (xi - x1) * di, 
                                   y1 + (yi - y1) * di);
                    add_vertex(vc, x2 + (xi - x2) * di, 
                                   y2 + (yi - y2) * di);
                }
                break;
            }
        }
    }